

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

sexp_conflict sexp_add_import_binding(sexp_conflict ctx,sexp_conflict env)

{
  sexp_conflict psVar1;
  sexp_conflict psVar2;
  sexp_conflict tmp;
  sexp_conflict sym;
  sexp_gc_var_t local_50;
  sexp_gc_var_t local_40;
  
  local_40.var = &sym;
  sym = (sexp_conflict)0x43e;
  local_50.var = &tmp;
  tmp = (sexp_conflict)0x43e;
  local_50.next = &local_40;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_50;
  psVar1 = (sexp_conflict)sexp_intern(ctx,"repl-import",0xffffffffffffffff);
  sym = psVar1;
  psVar2 = sexp_meta_env(ctx);
  tmp = (sexp_conflict)sexp_env_ref(ctx,psVar2,psVar1,0x43e);
  sym = (sexp_conflict)sexp_intern(ctx,"import",0xffffffffffffffff);
  sexp_env_define(ctx,env,sym,tmp);
  (ctx->value).context.saves = local_40.next;
  return env;
}

Assistant:

static sexp sexp_add_import_binding (sexp ctx, sexp env) {
  sexp_gc_var2(sym, tmp);
  sexp_gc_preserve2(ctx, sym, tmp);
  sym = sexp_intern(ctx, "repl-import", -1);
  tmp = sexp_env_ref(ctx, sexp_meta_env(ctx), sym, SEXP_VOID);
  sym = sexp_intern(ctx, "import", -1);
  sexp_env_define(ctx, env, sym, tmp);
  sexp_gc_release2(ctx);
  return env;
}